

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  urlpieces *puVar1;
  char **ppcVar2;
  undefined1 *puVar3;
  ushort uVar4;
  Curl_handler *pCVar5;
  curl_trc_feat *pcVar6;
  void *pvVar7;
  bool bVar8;
  undefined4 uVar9;
  _Bool _Var10;
  byte bVar11;
  uint uVar12;
  CURLUcode CVar13;
  int iVar14;
  CURLcode CVar15;
  CURLcode CVar16;
  connectdata *conn;
  char *pcVar17;
  CURLU *u;
  size_t sVar18;
  size_t sVar19;
  stsentry *psVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  char *v;
  ConnectBits CVar24;
  hsts *no_proxy;
  connectdata *conn_00;
  char *pcVar25;
  char *pcVar26;
  curltime cVar27;
  _Bool waitpipe;
  _Bool force_reuse;
  char *newurl;
  connectdata *existing;
  _Bool local_91;
  urlpieces *local_90;
  hsts *local_88;
  _Bool local_79;
  char *local_78 [4];
  _Bool *local_58;
  proxy_info *local_50;
  _Bool *local_48;
  connectdata *local_40;
  char *local_38;
  
  *asyncp = false;
  Curl_req_hard_reset(&data->req,data);
  local_40 = (connectdata *)0x0;
  local_79 = false;
  local_91 = false;
  *asyncp = false;
  CVar16 = CURLE_URL_MALFORMAT;
  conn = (connectdata *)0x0;
  CVar15 = CVar16;
  if ((data->state).url == (char *)0x0) goto switchD_0015f92a_caseD_1;
  conn = (connectdata *)(*Curl_ccalloc)(1,0x578);
  if (conn == (connectdata *)0x0) {
LAB_0015f97b:
    conn = (connectdata *)0x0;
    goto switchD_0015f92a_caseD_7;
  }
  conn->sock[0] = -1;
  conn->sock[1] = -1;
  conn->sockfd = -1;
  conn->writesockfd = -1;
  conn->connection_id = -1;
  (conn->primary).remote_port = -1;
  conn->remote_port = -1;
  Curl_conncontrol(conn,1);
  cVar27 = Curl_now();
  (conn->created).tv_sec = cVar27.tv_sec;
  (conn->created).tv_usec = cVar27.tv_usec;
  (conn->keepalive).tv_sec = (conn->created).tv_sec;
  (conn->keepalive).tv_usec = (conn->created).tv_usec;
  *(undefined4 *)&(conn->keepalive).field_0xc = *(undefined4 *)&(conn->created).field_0xc;
  bVar11 = (data->set).proxytype;
  (conn->http_proxy).proxytype = bVar11;
  (conn->socks_proxy).proxytype = '\x04';
  pcVar17 = (data->set).str[0x26];
  if ((pcVar17 == (char *)0x0) || (*pcVar17 == '\0')) {
    uVar22 = (ulong)conn->bits & 0xffffffffffffffef;
    uVar23 = 0;
  }
  else {
    uVar22 = (ulong)conn->bits | 0x10;
    uVar23 = 1;
    if (2 < bVar11) {
      uVar23 = (ulong)(bVar11 == 3);
    }
  }
  CVar24 = (ConnectBits)
           ((ulong)(((int)uVar23 * 2 ^ 2U) & (uint)(uVar22 >> 3) & 0x1fffffff) |
            uVar22 & 0xfffffffffffffffc | uVar23);
  conn->bits = CVar24;
  pcVar17 = (data->set).str[0x27];
  if ((pcVar17 != (char *)0x0) && (*pcVar17 != '\0')) {
    CVar24 = (ConnectBits)((ulong)CVar24 | 0x12);
    conn->bits = CVar24;
  }
  CVar24 = (ConnectBits)
           (((ulong)CVar24 & 0xfffffffffffffffb) +
           (ulong)((data->state).aptr.proxyuser != (char *)0x0) * 4);
  conn->bits = CVar24;
  uVar22 = (ulong)(*(uint *)&(data->set).field_0x894 >> 8 & 8);
  conn->bits = (ConnectBits)((ulong)CVar24 & 0xfffffffffffffff7 | uVar22);
  uVar23 = (ulong)(*(uint *)&(data->set).field_0x894 >> 1 & 0x8000);
  conn->bits = (ConnectBits)((ulong)CVar24 & 0xffffffffffff7ff7 | uVar22 | uVar23);
  conn->bits = (ConnectBits)
               ((ulong)CVar24 & 0xfffffffffffe7ff7 | uVar22 | uVar23 |
               (ulong)(*(uint *)&(data->set).field_0x894 >> 1 & 0x10000));
  conn->ip_version = (data->set).ipver;
  conn->connect_only = (data->set).field_0x894 & 1;
  conn->transport = '\x03';
  Curl_llist_init(&conn->easyq,(Curl_llist_dtor)0x0);
  pcVar17 = (data->set).str[0x1e];
  if (pcVar17 != (char *)0x0) {
    pcVar17 = (*Curl_cstrdup)(pcVar17);
    conn->localdev = pcVar17;
    if (pcVar17 == (char *)0x0) {
      (*Curl_cfree)((void *)0x0);
      (*Curl_cfree)(conn);
      goto LAB_0015f97b;
    }
  }
  conn->localportrange = (data->set).localportrange;
  conn->localport = (data->set).localport;
  pvVar7 = (data->set).closesocket_client;
  conn->fclosesocket = (data->set).fclosesocket;
  conn->closesocket_client = pvVar7;
  iVar14 = (conn->created).tv_usec;
  uVar9 = *(undefined4 *)&(conn->created).field_0xc;
  (conn->lastused).tv_sec = (conn->created).tv_sec;
  (conn->lastused).tv_usec = iVar14;
  *(undefined4 *)&(conn->lastused).field_0xc = uVar9;
  local_58 = asyncp;
  local_48 = protocol_done;
  if ((data->set).uh == (CURLU *)0x0) {
    up_free(data);
LAB_0015f858:
    bVar8 = false;
    u = curl_url();
  }
  else {
    bVar11 = (data->state).field_0x7be;
    up_free(data);
    if ((bVar11 & 8) != 0) goto LAB_0015f858;
    u = curl_url_dup((data->set).uh);
    bVar8 = true;
  }
  (data->state).uh = u;
  if (u == (CURLU *)0x0) goto switchD_0015f92a_caseD_7;
  if (((data->set).str[0x1d] != (char *)0x0) &&
     (sVar18 = Curl_is_absolute_url((data->state).url,(char *)0x0,0,true), sVar18 == 0)) {
    pcVar17 = curl_maprintf("%s://%s",(data->set).str[0x1d],(data->state).url);
    if (pcVar17 == (char *)0x0) goto switchD_0015f92a_caseD_7;
    uVar12 = *(uint *)&(data->state).field_0x7be;
    if ((uVar12 >> 0x10 & 1) != 0) {
      (*Curl_cfree)((data->state).url);
      uVar12 = *(uint *)&(data->state).field_0x7be;
    }
    (data->state).url = pcVar17;
    *(uint *)&(data->state).field_0x7be = uVar12 | 0x10000;
  }
  if (!bVar8) {
    uVar12 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x894 >> 0x20);
    CVar13 = curl_url_set(u,CURLUPART_URL,(data->state).url,
                          (uVar12 >> 0xc & 0x20) + (uVar12 >> 7 & 0x10) + 0x208);
    if (CVar13 == CURLUE_OK) {
      CVar13 = curl_url_get(u,CURLUPART_URL,local_78,0);
      CVar15 = CURLE_URL_MALFORMAT;
      switch(CVar13) {
      case CURLUE_OK:
        uVar12 = *(uint *)&(data->state).field_0x7be;
        if ((uVar12 >> 0x10 & 1) != 0) {
          (*Curl_cfree)((data->state).url);
          uVar12 = *(uint *)&(data->state).field_0x7be;
        }
        (data->state).url = local_78[0];
        *(uint *)&(data->state).field_0x7be = uVar12 | 0x10000;
        goto LAB_0015f8fc;
      case CURLUE_UNSUPPORTED_SCHEME:
        CVar15 = CURLE_UNSUPPORTED_PROTOCOL;
        break;
      case CURLUE_OUT_OF_MEMORY:
        CVar15 = CURLE_OUT_OF_MEMORY;
        break;
      case CURLUE_USER_NOT_ALLOWED:
        CVar15 = CURLE_LOGIN_DENIED;
      }
    }
    else {
      pcVar17 = curl_url_strerror(CVar13);
      Curl_failf(data,"URL rejected: %s",pcVar17);
      CVar15 = CURLE_URL_MALFORMAT;
      if (CVar13 - CURLUE_UNSUPPORTED_SCHEME < 4) {
        CVar15 = *(CURLcode *)(&DAT_00180938 + (ulong)(CVar13 - CURLUE_UNSUPPORTED_SCHEME) * 4);
      }
    }
    goto switchD_0015f92a_caseD_1;
  }
LAB_0015f8fc:
  puVar1 = &(data->state).up;
  CVar13 = curl_url_get(u,CURLUPART_SCHEME,&puVar1->scheme,0);
  CVar15 = CVar16;
  switch(CVar13) {
  case CURLUE_OK:
    ppcVar2 = &(data->state).up.hostname;
    CVar13 = curl_url_get(u,CURLUPART_HOST,ppcVar2,0);
    if (CVar13 == CURLUE_OK) {
      pcVar17 = *ppcVar2;
      sVar19 = strlen(pcVar17);
      if (0xffff < sVar19) {
        Curl_failf(data,"Too long hostname (maximum is %d)",0xffff);
        goto switchD_0015f92a_caseD_1;
      }
    }
    else {
      iVar14 = curl_strequal("file",puVar1->scheme);
      if (iVar14 == 0) goto switchD_0015f92a_caseD_7;
      pcVar17 = *ppcVar2;
    }
    local_90 = puVar1;
    if (pcVar17 == (char *)0x0) {
      pcVar25 = (char *)0x0;
    }
    else {
      pcVar25 = pcVar17;
      if (*pcVar17 == '[') {
        puVar3 = &(conn->bits).field_0x1;
        *puVar3 = *puVar3 | 4;
        pcVar25 = pcVar17 + 1;
        sVar19 = strlen(pcVar25);
        pcVar17[sVar19] = '\0';
        zonefrom_url(u,data,conn);
      }
    }
    if (pcVar25 == (char *)0x0) {
      pcVar25 = "";
    }
    pcVar17 = (*Curl_cstrdup)(pcVar25);
    (conn->host).rawalloc = pcVar17;
    if (pcVar17 == (char *)0x0) goto switchD_0015f92a_caseD_7;
    (conn->host).name = pcVar17;
    CVar15 = Curl_idnconvert_hostname(&conn->host);
    if (CVar15 != CURLE_OK) goto switchD_0015f92a_caseD_1;
    if ((data->hsts != (hsts *)0x0) &&
       (iVar14 = curl_strequal("http",local_90->scheme), iVar14 != 0)) {
      local_88 = data->hsts;
      pcVar17 = (conn->host).name;
      sVar19 = strlen(pcVar17);
      psVar20 = Curl_hsts(local_88,pcVar17,sVar19,true);
      puVar1 = local_90;
      if (psVar20 != (stsentry *)0x0) {
        (*Curl_cfree)(local_90->scheme);
        puVar1->scheme = (char *)0x0;
        CVar13 = curl_url_set(u,CURLUPART_SCHEME,"https",0);
        CVar15 = CURLE_URL_MALFORMAT;
        switch(CVar13) {
        case CURLUE_OK:
          if (((data->state).field_0x7c0 & 1) != 0) {
            (*Curl_cfree)((data->state).url);
            (data->state).url = (char *)0x0;
          }
          CVar13 = curl_url_get(u,CURLUPART_URL,local_78,0);
          switch(CVar13) {
          case CURLUE_OK:
            CVar13 = curl_url_get(u,CURLUPART_SCHEME,&local_90->scheme,0);
            local_88 = (hsts *)CONCAT44(local_88._4_4_,CVar13);
            if (CVar13 == CURLUE_OK) {
              (data->state).url = local_78[0];
              puVar3 = &(data->state).field_0x7c0;
              *puVar3 = *puVar3 | 1;
              if ((((data->set).field_0x897 & 0x40) != 0) &&
                 ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar6->log_level)))) {
                Curl_infof(data,"Switched from HTTP to HTTPS due to HSTS => %s");
              }
              goto LAB_0015fd0c;
            }
            (*Curl_cfree)(local_78[0]);
            if ((curl_proxytype)local_88 - 5 < 4) {
              CVar15 = *(CURLcode *)(&DAT_00180938 + (ulong)((curl_proxytype)local_88 - 5) * 4);
            }
            break;
          case CURLUE_UNSUPPORTED_SCHEME:
            goto switchD_0015fc1f_caseD_5;
          case CURLUE_OUT_OF_MEMORY:
            goto switchD_0015fc1f_caseD_7;
          case CURLUE_USER_NOT_ALLOWED:
            goto switchD_0015fc1f_caseD_8;
          }
          break;
        case CURLUE_UNSUPPORTED_SCHEME:
switchD_0015fc1f_caseD_5:
          CVar15 = CURLE_UNSUPPORTED_PROTOCOL;
          break;
        case CURLUE_OUT_OF_MEMORY:
switchD_0015fc1f_caseD_7:
          CVar15 = CURLE_OUT_OF_MEMORY;
          break;
        case CURLUE_USER_NOT_ALLOWED:
switchD_0015fc1f_caseD_8:
          CVar15 = CURLE_LOGIN_DENIED;
        }
        goto switchD_0015f92a_caseD_1;
      }
    }
LAB_0015fd0c:
    pcVar17 = "";
    CVar15 = findprotocol(data,conn,(data->state).up.scheme);
    if (CVar15 != CURLE_OK) goto switchD_0015f92a_caseD_5;
    if (((data->state).aptr.passwd == (char *)0x0) ||
       ((*(uint *)&(data->state).field_0x7be & 3) != 2)) {
      ppcVar2 = &(data->state).up.password;
      CVar13 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar2,0);
      switch(CVar13) {
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_0015f92a_caseD_5;
      case CURLUE_URLDECODE:
      case CURLUE_UNKNOWN_PART:
      case CURLUE_NO_SCHEME:
      case CURLUE_NO_USER:
switchD_0015fd77_caseD_6:
        CVar15 = CURLE_URL_MALFORMAT;
        goto switchD_0015f92a_caseD_1;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_0015f92a_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_0015f92a_caseD_8;
      case CURLUE_NO_PASSWORD:
        break;
      default:
        if (CVar13 != CURLUE_OK) goto switchD_0015fd77_caseD_6;
        CVar15 = Curl_urldecode(*ppcVar2,0,local_78,(size_t *)0x0,
                                ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
        if (CVar15 != CURLE_OK) goto switchD_0015f92a_caseD_1;
        conn->passwd = local_78[0];
        CVar15 = Curl_setstropt(&(data->state).aptr.passwd,local_78[0]);
        if (CVar15 != CURLE_OK) goto switchD_0015f92a_caseD_1;
        *(uint *)&(data->state).field_0x7be = (*(uint *)&(data->state).field_0x7be & 0xfffffffc) + 1
        ;
      }
    }
    if (((data->state).aptr.user == (char *)0x0) || ((*(uint *)&(data->state).field_0x7be & 3) != 2)
       ) {
      ppcVar2 = &(data->state).up.user;
      CVar13 = curl_url_get(u,CURLUPART_USER,ppcVar2,0);
      CVar15 = CVar16;
      switch(CVar13) {
      case CURLUE_OK:
        CVar15 = Curl_urldecode(*ppcVar2,0,local_78,(size_t *)0x0,
                                ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
        if (CVar15 != CURLE_OK) goto switchD_0015f92a_caseD_1;
        conn->user = local_78[0];
        CVar15 = Curl_setstropt(&(data->state).aptr.user,local_78[0]);
        *(uint *)&(data->state).field_0x7be = (*(uint *)&(data->state).field_0x7be & 0xfffffffc) + 1
        ;
        if (CVar15 != CURLE_OK) goto switchD_0015f92a_caseD_1;
        break;
      default:
        goto switchD_0015f92a_caseD_1;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_0015f92a_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_0015f92a_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_0015f92a_caseD_8;
      case CURLUE_NO_USER:
        break;
      }
    }
    break;
  default:
    goto switchD_0015f92a_caseD_1;
  case CURLUE_UNSUPPORTED_SCHEME:
    goto switchD_0015f92a_caseD_5;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_0015f92a_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
    goto switchD_0015f92a_caseD_8;
  }
  ppcVar2 = &(data->state).up.options;
  CVar13 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar2,0x40);
  CVar15 = CVar16;
  switch(CVar13) {
  case CURLUE_UNSUPPORTED_SCHEME:
switchD_0015f92a_caseD_5:
    CVar15 = CURLE_UNSUPPORTED_PROTOCOL;
    break;
  case CURLUE_URLDECODE:
  case CURLUE_UNKNOWN_PART:
  case CURLUE_NO_SCHEME:
  case CURLUE_NO_USER:
  case CURLUE_NO_PASSWORD:
    break;
  case CURLUE_USER_NOT_ALLOWED:
switchD_0015f92a_caseD_8:
    CVar15 = CURLE_LOGIN_DENIED;
    break;
  case CURLUE_NO_OPTIONS:
switchD_0015fe5f_caseD_d:
    CVar13 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0x80);
    switch(CVar13) {
    case CURLUE_OK:
      ppcVar2 = &(data->state).up.port;
      CVar13 = curl_url_get(u,CURLUPART_PORT,ppcVar2,1);
      if (CVar13 == CURLUE_OK) {
        uVar4 = (data->set).use_port;
        if ((uVar4 == 0) || (uVar12 = (uint)uVar4, ((data->state).field_0x7be & 0x40) == 0)) {
          local_38 = *ppcVar2;
          iVar14 = Curl_str_number(&local_38,(curl_off_t *)local_78,0xffff);
          uVar12 = (uint)local_78[0];
          if (iVar14 != 0) goto LAB_0015ffbc;
        }
        conn->remote_port = uVar12 & 0xffff;
        (conn->primary).remote_port = uVar12 & 0xffff;
      }
      else {
        iVar14 = curl_strequal("file",local_90->scheme);
        if (iVar14 == 0) goto switchD_0015f92a_caseD_7;
      }
LAB_0015ffbc:
      curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
      uVar12 = (data->set).scope_id;
      if (uVar12 != 0) {
        conn->scope_id = uVar12;
      }
      pcVar25 = (data->set).str[0x42];
      if (pcVar25 != (char *)0x0) {
        pcVar25 = (*Curl_cstrdup)(pcVar25);
        conn->sasl_authzid = pcVar25;
        if (pcVar25 == (char *)0x0) goto switchD_0015f92a_caseD_7;
      }
      pcVar25 = (data->set).str[0x3c];
      if (pcVar25 != (char *)0x0) {
        pcVar25 = (*Curl_cstrdup)(pcVar25);
        conn->oauth_bearer = pcVar25;
        if (pcVar25 == (char *)0x0) goto switchD_0015f92a_caseD_7;
      }
      pcVar25 = (data->set).str[0x3d];
      if (pcVar25 == (char *)0x0) {
        CVar24 = conn->bits;
      }
      else {
        pcVar25 = (*Curl_cstrdup)(pcVar25);
        conn->unix_domain_socket = pcVar25;
        if (pcVar25 == (char *)0x0) goto switchD_0015f92a_caseD_7;
        CVar24 = (ConnectBits)
                 ((ulong)conn->bits & 0xfffffffffbffffff |
                 (ulong)((uint)(*(ulong *)&(data->set).field_0x894 >> 0x16) & 0x4000000));
        conn->bits = CVar24;
      }
      if (((ulong)CVar24 & 4) == 0) {
LAB_001600de:
        pcVar25 = (data->set).str[0x26];
        if (pcVar25 == (char *)0x0) {
          pcVar25 = (char *)0x0;
        }
        else {
          pcVar25 = (*Curl_cstrdup)(pcVar25);
          if (pcVar25 == (char *)0x0) {
            Curl_failf(data,"memory shortage");
            CVar15 = CURLE_OUT_OF_MEMORY;
            goto LAB_00160352;
          }
        }
        pcVar26 = (data->set).str[0x27];
        if (pcVar26 == (char *)0x0) {
          local_90 = (urlpieces *)0x0;
LAB_00160168:
          if ((data->set).str[0x32] == (char *)0x0) {
            pcVar26 = "no_proxy";
            local_88 = (hsts *)curl_getenv("no_proxy");
            if (local_88 == (hsts *)0x0) {
              pcVar26 = "NO_PROXY";
              local_88 = (hsts *)curl_getenv("NO_PROXY");
              if (local_88 == (hsts *)0x0) goto LAB_00160176;
            }
            if ((((data->set).field_0x897 & 0x40) != 0) &&
               ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                (0 < pcVar6->log_level)))) {
              Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar26,local_88);
            }
          }
          else {
LAB_00160176:
            local_88 = (hsts *)0x0;
          }
          no_proxy = (hsts *)(data->set).str[0x32];
          if (no_proxy == (hsts *)0x0) {
            no_proxy = local_88;
          }
          _Var10 = Curl_check_noproxy((conn->host).name,(char *)no_proxy);
          if (_Var10) {
            (*Curl_cfree)(pcVar25);
            (*Curl_cfree)(local_90);
            (*Curl_cfree)(local_88);
LAB_001603c4:
            uVar22 = (ulong)conn->bits & 0xfffffffffffffffc;
          }
          else {
            if (pcVar25 == (char *)0x0 && local_90 == (urlpieces *)0x0) {
              pcVar26 = (char *)local_78;
              curl_msnprintf(pcVar26,0x14,"%s_proxy",conn->handler->scheme);
              pcVar25 = curl_getenv(pcVar26);
              if (pcVar25 == (char *)0x0) {
                v = "http_proxy";
                pcVar26 = (char *)local_78;
                iVar14 = curl_strequal("http_proxy",pcVar26);
                if (iVar14 == 0) {
                  Curl_strntoupper(pcVar26,pcVar26,0x14);
                  pcVar25 = curl_getenv(pcVar26);
                  if (pcVar25 != (char *)0x0) goto LAB_00160204;
                }
                iVar14 = curl_strequal("ws_proxy",(char *)local_78);
                if (iVar14 == 0) {
                  pcVar26 = (char *)local_78;
                  iVar14 = curl_strequal("wss_proxy",pcVar26);
                  if (iVar14 != 0) {
                    pcVar25 = curl_getenv("https_proxy");
                    if (pcVar25 != (char *)0x0) goto LAB_00160204;
                    v = "HTTPS_PROXY";
                    goto LAB_0016071b;
                  }
                }
                else {
LAB_0016071b:
                  pcVar25 = curl_getenv(v);
                  if (pcVar25 != (char *)0x0) {
                    pcVar26 = (char *)local_78;
                    goto LAB_00160204;
                  }
                }
                pcVar26 = "all_proxy";
                pcVar25 = curl_getenv("all_proxy");
                if (pcVar25 == (char *)0x0) {
                  pcVar26 = "ALL_PROXY";
                  pcVar25 = curl_getenv("ALL_PROXY");
                  if (pcVar25 == (char *)0x0) {
                    pcVar25 = (char *)0x0;
                    goto LAB_00160236;
                  }
                }
              }
LAB_00160204:
              if ((((data->set).field_0x897 & 0x40) != 0) &&
                 ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar6->log_level)))) {
                Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar26,pcVar25);
              }
            }
LAB_00160236:
            (*Curl_cfree)(local_88);
            if (pcVar25 == (char *)0x0) {
LAB_00160263:
              pcVar25 = (char *)0x0;
            }
            else if (((conn->unix_domain_socket != (char *)0x0) || (*pcVar25 == '\0')) ||
                    ((conn->handler->flags & 0x10) != 0)) {
              (*Curl_cfree)(pcVar25);
              goto LAB_00160263;
            }
            if (local_90 == (urlpieces *)0x0) {
LAB_0016036e:
              if (pcVar25 == (char *)0x0) goto LAB_001603c4;
              local_88 = (hsts *)CONCAT44(local_88._4_4_,(uint)(conn->http_proxy).proxytype);
              local_90 = (urlpieces *)0x0;
              bVar8 = false;
LAB_00160397:
              local_50 = &conn->http_proxy;
              CVar15 = parse_proxy(data,conn,pcVar25,(curl_proxytype)local_88);
              (*Curl_cfree)(pcVar25);
              if (CVar15 != CURLE_OK) {
                pcVar25 = (char *)0x0;
                goto LAB_0016041b;
              }
              if (bVar8) goto LAB_0016065e;
            }
            else {
              if ((*(char *)&local_90->scheme == '\0') || ((conn->handler->flags & 0x10) != 0)) {
                (*Curl_cfree)(local_90);
                goto LAB_0016036e;
              }
              local_50 = &conn->http_proxy;
              local_88 = (hsts *)CONCAT44(local_88._4_4_,(uint)(conn->http_proxy).proxytype);
              bVar8 = true;
              if (pcVar25 != (char *)0x0) goto LAB_00160397;
LAB_0016065e:
              puVar1 = local_90;
              CVar15 = parse_proxy(data,conn,(char *)local_90,(curl_proxytype)local_88);
              (*Curl_cfree)(puVar1);
              if (CVar15 != CURLE_OK) goto LAB_00160352;
            }
            if ((local_50->host).rawalloc == (char *)0x0) {
              CVar24 = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffff6);
              conn->bits = CVar24;
              if ((conn->socks_proxy).host.rawalloc == (char *)0x0) goto LAB_00160862;
              if ((conn->socks_proxy).user == (char *)0x0) {
                pcVar25 = (conn->socks_proxy).passwd;
                (conn->socks_proxy).user = (conn->http_proxy).user;
                (conn->http_proxy).user = (char *)0x0;
                (*Curl_cfree)(pcVar25);
                (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
                (conn->http_proxy).passwd = (char *)0x0;
                CVar24 = conn->bits;
              }
            }
            else {
              CVar24 = conn->bits;
              if ((conn->handler->protocol & 0xc0000003) == 0) {
                if (((conn->handler->flags & 0x800) == 0) || (((ulong)CVar24 & 8) != 0)) {
                  CVar24 = (ConnectBits)((ulong)CVar24 | 8);
                }
                else {
                  conn->handler = &Curl_handler_http;
                }
              }
              CVar24 = (ConnectBits)((ulong)CVar24 | 1);
              if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
LAB_00160862:
                uVar22 = (ulong)CVar24 & 0xfffffffffffffffd;
                goto LAB_001603cf;
              }
            }
            uVar22 = (ulong)CVar24 | 2;
          }
LAB_001603cf:
          uVar23 = 0x10;
          if ((uVar22 & 1) == 0) {
            uVar23 = (ulong)((int)uVar22 * 8 & 0x10);
          }
          conn->bits = (ConnectBits)(uVar22 & 0xffffffffffffffef | uVar23);
          if (uVar23 == 0) {
            conn->bits = (ConnectBits)(uVar22 & 0xffffffffffffffe0);
            (conn->http_proxy).proxytype = '\0';
          }
          pcVar25 = (char *)0x0;
          local_90 = (urlpieces *)0x0;
          CVar15 = CURLE_OK;
        }
        else {
          local_90 = (urlpieces *)(*Curl_cstrdup)(pcVar26);
          if (local_90 != (urlpieces *)0x0) goto LAB_00160168;
          local_90 = (urlpieces *)0x0;
          Curl_failf(data,"memory shortage");
          CVar15 = CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        pcVar25 = (data->state).aptr.proxyuser;
        pcVar26 = (data->state).aptr.proxypasswd;
        if (pcVar25 == (char *)0x0) {
          pcVar25 = "";
        }
        pcVar25 = (*Curl_cstrdup)(pcVar25);
        (conn->http_proxy).user = pcVar25;
        CVar15 = CURLE_OUT_OF_MEMORY;
        if (pcVar25 != (char *)0x0) {
          if (pcVar26 == (char *)0x0) {
            pcVar26 = "";
          }
          pcVar25 = (*Curl_cstrdup)(pcVar26);
          (conn->http_proxy).passwd = pcVar25;
          if (pcVar25 != (char *)0x0) goto LAB_001600de;
          (*Curl_cfree)((conn->http_proxy).user);
          (conn->http_proxy).user = (char *)0x0;
        }
LAB_00160352:
        pcVar25 = (char *)0x0;
        local_90 = (urlpieces *)0x0;
      }
LAB_0016041b:
      (*Curl_cfree)(local_90);
      (*Curl_cfree)(pcVar25);
      if (CVar15 != CURLE_OK) break;
      if (((conn->given->flags & 1) != 0) && (((ulong)conn->bits & 1) != 0)) {
        conn->bits = (ConnectBits)((ulong)conn->bits | 8);
      }
      uVar4 = (data->set).use_port;
      if ((uVar4 != 0) && (((data->state).field_0x7be & 0x40) != 0)) {
        conn->remote_port = (uint)uVar4;
        curl_msnprintf((char *)local_78,0x10,"%d");
        CVar13 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)local_78,0);
        if (CVar13 != CURLUE_OK) goto switchD_0015f92a_caseD_7;
      }
      CVar15 = override_login(data,conn);
      if (((CVar15 != CURLE_OK) || (CVar15 = set_login(data,conn), CVar15 != CURLE_OK)) ||
         (CVar15 = parse_connect_to_slist(data,conn,(data->set).connect_to), CVar15 != CURLE_OK))
      break;
      CVar24 = conn->bits;
      if (((ulong)CVar24 & 1) != 0) {
        CVar15 = Curl_idnconvert_hostname(&(conn->http_proxy).host);
        if (CVar15 != CURLE_OK) break;
        CVar24 = conn->bits;
      }
      if (((ulong)CVar24 & 2) != 0) {
        CVar15 = Curl_idnconvert_hostname(&(conn->socks_proxy).host);
        if (CVar15 != CURLE_OK) break;
        CVar24 = conn->bits;
      }
      if ((CVar24._0_4_ >> 8 & 1) != 0) {
        CVar15 = Curl_idnconvert_hostname(&conn->conn_to_host);
        if (CVar15 != CURLE_OK) break;
        CVar24 = conn->bits;
        if ((CVar24._0_4_ >> 8 & 1) != 0) {
          iVar14 = curl_strequal((conn->conn_to_host).name,(conn->host).name);
          CVar24 = conn->bits;
          if (iVar14 != 0) {
            CVar24 = (ConnectBits)((ulong)CVar24 & 0xfffffffffffffeff);
            conn->bits = CVar24;
          }
        }
      }
      if (((CVar24._0_4_ >> 9 & 1) != 0) && (conn->conn_to_port == conn->remote_port)) {
        CVar24 = (ConnectBits)((ulong)CVar24 & 0xfffffffffffffdff);
        conn->bits = CVar24;
      }
      if (((ulong)CVar24 & 1) != 0 && ((ulong)CVar24 & 0x300) != 0) {
        conn->bits = (ConnectBits)((ulong)CVar24 | 8);
      }
      CVar15 = setup_connection_internals(data,conn);
      if (CVar15 != CURLE_OK) break;
      pCVar5 = conn->handler;
      if ((pCVar5->flags & 0x10) == 0) {
        conn->recv[0] = Curl_cf_recv;
        conn->send[0] = Curl_cf_send;
        conn->recv[1] = Curl_cf_recv;
        conn->send[1] = Curl_cf_send;
        conn->bits = (ConnectBits)
                     ((ulong)conn->bits & 0xffffffffff7fffff |
                     (ulong)((uint)(*(ulong *)&(data->set).field_0x894 >> 0x12) & 0x800000));
        CVar15 = Curl_ssl_easy_config_complete(data);
        if (CVar15 != CURLE_OK) break;
        Curl_cpool_prune_dead(data);
        uVar22 = *(ulong *)&(data->set).field_0x894;
        if ((uVar22 >> 0x20 & 1) != 0) {
          if (((uVar22 & 1) == 0) && ((data->state).followlocation != 0)) goto LAB_0016099f;
LAB_00160ac8:
          if (((conn->handler->flags & 0x100) != 0) && (((data->set).field_0x899 & 4) != 0)) {
            puVar3 = &(conn->bits).field_0x3;
            *puVar3 = *puVar3 | 1;
          }
          if (local_91 == true) {
            if ((((data->set).field_0x897 & 0x40) != 0) &&
               ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                (0 < pcVar6->log_level)))) {
              pcVar17 = "Waiting on connection to negotiate possible multiplexing.";
LAB_00160b4f:
              Curl_infof(data,pcVar17);
            }
          }
          else {
            iVar14 = Curl_cpool_check_limits(data,conn);
            if (iVar14 == 2) {
              uVar12 = (uint)*(undefined8 *)&(data->set).field_0x894;
              if (-1 < (data->set).dohfor_mid) {
                if (((uVar12 >> 0x1e & 1) != 0) &&
                   ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar6->log_level)))) {
                  Curl_infof(data,"Allowing DoH to override max connection limit");
                }
                goto LAB_00160bbc;
              }
              if (((uVar12 >> 0x1e & 1) != 0) &&
                 ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar6->log_level)))) {
                Curl_infof(data,"No connections available, total of %ld reached.",
                           data->multi->max_total_connections);
              }
            }
            else {
              if (iVar14 != 1) {
LAB_00160bbc:
                CVar15 = Curl_ssl_conn_config_init(data,conn);
                if (CVar15 != CURLE_OK) break;
                Curl_attach_connection(data,conn);
                CVar15 = Curl_cpool_add(data,conn);
                if (CVar15 != CURLE_OK) break;
                if ((((data->state).authhost.picked & 8) != 0) &&
                   (bVar11 = (data->state).authhost.field_0x18, (bVar11 & 1) != 0)) {
                  if ((((data->set).field_0x897 & 0x40) != 0) &&
                     ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar6->log_level)))) {
                    Curl_infof(data,"NTLM picked AND auth done set, clear picked");
                    bVar11 = (data->state).authhost.field_0x18;
                  }
                  (data->state).authhost.picked = 0;
                  (data->state).authhost.field_0x18 = bVar11 & 0xfe;
                }
                conn_00 = conn;
                if ((((data->state).authproxy.picked & 8) != 0) &&
                   (bVar11 = (data->state).authproxy.field_0x18, (bVar11 & 1) != 0)) {
                  if ((((data->set).field_0x897 & 0x40) != 0) &&
                     ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar6->log_level)))) {
                    Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked");
                    bVar11 = (data->state).authproxy.field_0x18;
                  }
                  (data->state).authproxy.picked = 0;
                  (data->state).authproxy.field_0x18 = bVar11 & 0xfe;
                }
                goto LAB_00160a82;
              }
              if ((((data->set).field_0x897 & 0x40) != 0) &&
                 ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar6->log_level)))) {
                pcVar17 = "No more connections allowed to host";
                goto LAB_00160b4f;
              }
            }
          }
          Curl_conn_free(data,conn);
          CVar15 = CURLE_NO_CONNECTION_AVAILABLE;
          conn = (connectdata *)0x0;
          break;
        }
        if ((uVar22 & 1) != 0) goto LAB_00160ac8;
LAB_0016099f:
        _Var10 = ConnectionExists(data,conn,&local_40,&local_79,&local_91);
        if (!_Var10) goto LAB_00160ac8;
        if ((conn->given->flags & 1) == 0) {
          _Var10 = Curl_conn_is_ssl(conn,0);
          pcVar17 = "";
          if (_Var10) {
            pcVar17 = " (upgraded to SSL)";
          }
        }
        conn_00 = local_40;
        reuse_conn(data,conn,local_40);
        if ((((data->set).field_0x897 & 0x40) != 0) &&
           ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))
           )) {
          pcVar25 = "proxy";
          if (((ulong)conn_00->bits & 0x10) == 0) {
            pcVar25 = "host";
          }
          lVar21 = 0xd8;
          if (((conn_00->socks_proxy).host.name == (char *)0x0) &&
             (lVar21 = 0x110, (conn_00->http_proxy).host.name == (char *)0x0)) {
            lVar21 = 0x88;
          }
          Curl_infof(data,"Re-using existing %s: connection%s with %s %s",conn_00->given->scheme,
                     pcVar17,pcVar25,*(undefined8 *)((long)&(conn_00->cpool_node)._list + lVar21));
        }
LAB_00160a82:
        Curl_init_do(data,conn_00);
        CVar15 = setup_range(data);
        conn = conn_00;
        if (CVar15 != CURLE_OK) break;
        if (((ulong)conn_00->bits & 0x40) == 0) {
          CVar15 = resolve_server(data,conn_00,local_58);
          if (CVar15 != CURLE_OK) break;
        }
        else {
          *local_58 = false;
        }
        pCVar5 = conn_00->handler;
        (data->info).conn_scheme = pCVar5->scheme;
        (data->info).conn_protocol = pCVar5->protocol & 0x3ffffff;
        (data->info).field_0xf4 = (data->info).field_0xf4 & 0xfd | *(byte *)&conn_00->bits >> 3 & 2;
        CVar15 = Curl_conn_ev_data_setup(data);
      }
      else {
        (data->info).conn_scheme = pCVar5->scheme;
        (data->info).conn_protocol = pCVar5->protocol & 0x3ffffff;
        CVar16 = (*pCVar5->connect_it)(data,(_Bool *)local_78);
        if (CVar16 == CURLE_OK) {
          Curl_attach_connection(data,conn);
          CVar15 = Curl_cpool_add(data,conn);
          if ((CVar15 != CURLE_OK) || (CVar15 = setup_range(data), CVar15 != CURLE_OK)) {
            (*conn->handler->done)(data,CVar15,false);
            goto LAB_0016093e;
          }
          Curl_xfer_setup_nop(data);
        }
        Curl_init_do(data,conn);
        CVar15 = CVar16;
      }
LAB_0016093e:
      if (CVar15 == CURLE_OK) {
        sVar18 = Curl_llist_count(&conn->easyq);
        if (1 < sVar18) {
          *local_48 = true;
          return CURLE_OK;
        }
        if (*local_58 != false) {
          return CURLE_OK;
        }
        CVar15 = Curl_setup_conn(data,local_48);
      }
    default:
      break;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_0015f92a_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_0015f92a_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_0015f92a_caseD_8;
    }
  default:
    if (CVar13 != CURLUE_OK) break;
    pcVar25 = (*Curl_cstrdup)(*ppcVar2);
    conn->options = pcVar25;
    if (pcVar25 != (char *)0x0) goto switchD_0015fe5f_caseD_d;
  case CURLUE_OUT_OF_MEMORY:
switchD_0015f92a_caseD_7:
    CVar15 = CURLE_OUT_OF_MEMORY;
  }
switchD_0015f92a_caseD_1:
  CVar16 = CURLE_NO_CONNECTION_AVAILABLE;
  if (((CVar15 != CURLE_NO_CONNECTION_AVAILABLE) && (CVar16 = CVar15, conn != (connectdata *)0x0))
     && (CVar15 != CURLE_OK)) {
    Curl_detach_connection(data);
    Curl_conn_terminate(data,conn,true);
  }
  return CVar16;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* Set the request to virgin state based on transfer settings */
  Curl_req_hard_reset(&data->req, data);

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn) > 1)
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that is either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(data, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We are not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_detach_connection(data);
    Curl_conn_terminate(data, conn, TRUE);
  }

  return result;
}